

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdsregion_test.cc
# Opt level: O0

int test_create_account_for_inner(void)

{
  code *pcVar1;
  char *__s;
  RdsRegionCreateAccountForInnerRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_231;
  int ret;
  HttpTestListener *local_210;
  HttpTestListener *listener;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [55];
  allocator<char> local_179;
  string local_178 [32];
  RdsRegionCreateAccountForInnerRequestType *local_158;
  RdsRegion *rdsregion;
  undefined1 local_148 [7];
  RdsRegionCreateAccountForInnerResponseType resp;
  RdsRegionCreateAccountForInnerRequestType req;
  
  aliyun::RdsRegionCreateAccountForInnerRequestType::RdsRegionCreateAccountForInnerRequestType
            ((RdsRegionCreateAccountForInnerRequestType *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"cn-hangzhou",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"my_appid",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"my_secret",&local_1d9);
  pRVar2 = (RdsRegionCreateAccountForInnerRequestType *)
           aliyun::RdsRegion::CreateRdsRegionClient(local_178,local_1b0,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  local_158 = pRVar2;
  if (pRVar2 == (RdsRegionCreateAccountForInnerRequestType *)0x0) {
    aliyun::RdsRegionCreateAccountForInnerRequestType::~RdsRegionCreateAccountForInnerRequestType
              ((RdsRegionCreateAccountForInnerRequestType *)local_148);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::RdsRegion::SetProxyHost((RdsRegion *)pRVar2,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::RdsRegion::SetUseTls((RdsRegion *)local_158,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_create_account_for_inner_response;
  local_210 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_231);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_231);
  HttpTestListener::Start(local_210);
  std::__cxx11::string::operator=((string *)local_148,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"DBInstanceId");
  std::__cxx11::string::operator=
            ((string *)(req.db_instance_id.field_2._M_local_buf + 8),"AccountName");
  std::__cxx11::string::operator=
            ((string *)(req.account_name.field_2._M_local_buf + 8),"AccountPassword");
  std::__cxx11::string::operator=
            ((string *)(req.account_password.field_2._M_local_buf + 8),"DBName");
  std::__cxx11::string::operator=
            ((string *)(req.db_name.field_2._M_local_buf + 8),"AccountPrivilege");
  std::__cxx11::string::operator=
            ((string *)(req.account_privilege.field_2._M_local_buf + 8),"AccountDescription");
  std::__cxx11::string::operator=
            ((string *)(req.account_description.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::RdsRegion::CreateAccountForInner
            (local_158,(RdsRegionCreateAccountForInnerResponseType *)local_148,
             (RdsRegionErrorInfo *)((long)&rdsregion + 7));
  HttpTestListener::WaitComplete(local_210);
  pHVar3 = local_210;
  if (local_210 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_210);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_158;
  if (local_158 != (RdsRegionCreateAccountForInnerRequestType *)0x0) {
    aliyun::RdsRegion::~RdsRegion((RdsRegion *)local_158);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_create_account_for_inner() {
  RdsRegionCreateAccountForInnerRequestType req;
  RdsRegionCreateAccountForInnerResponseType resp;
  RdsRegion* rdsregion = RdsRegion::CreateRdsRegionClient("cn-hangzhou", "my_appid", "my_secret");
  if(!rdsregion) return 0;
  rdsregion->SetProxyHost("127.0.0.1:12234");
  rdsregion->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_create_account_for_inner_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.db_instance_id = "DBInstanceId";
  req.account_name = "AccountName";
  req.account_password = "AccountPassword";
  req.db_name = "DBName";
  req.account_privilege = "AccountPrivilege";
  req.account_description = "AccountDescription";
  req.owner_account = "OwnerAccount";
  int ret = rdsregion->CreateAccountForInner(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete rdsregion;
}